

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

bool __thiscall Parser::is_builtin_type(Parser *this)

{
  bool local_21;
  bool local_11;
  Parser *this_local;
  
  local_11 = false;
  if (this->tok->kind == Keyword) {
    local_21 = true;
    if (((((this->tok->i != 3) && (local_21 = true, this->tok->i != 4)) &&
         (local_21 = true, this->tok->i != 8)) &&
        ((((local_21 = true, this->tok->i != 0xb && (local_21 = true, this->tok->i != 9)) &&
          ((local_21 = true, this->tok->i != 10 &&
           ((local_21 = true, this->tok->i != 0x1b && (local_21 = true, this->tok->i != 0x23))))))
         && (local_21 = true, this->tok->i != 0x29)))) &&
       ((((local_21 = true, this->tok->i != 0x2a && (local_21 = true, this->tok->i != 0x38)) &&
         (local_21 = true, this->tok->i != 0x39)) &&
        ((local_21 = true, this->tok->i != 0x4a && (local_21 = true, this->tok->i != 0x4d)))))) {
      local_21 = this->tok->i == 0x4f;
    }
    local_11 = local_21;
  }
  return local_11;
}

Assistant:

bool is_builtin_type() const {
    return (tok->kind == TokenKind::Keyword &&
            (tok->i == key_auto ||
             tok->i == key_bool ||
             tok->i == key_char ||
             tok->i == key_char8_t ||
             tok->i == key_char16_t ||
             tok->i == key_char32_t ||
             tok->i == key_double ||
             tok->i == key_float ||
             tok->i == key_int ||
             tok->i == key_long ||
             tok->i == key_short ||
             tok->i == key_signed ||
             tok->i == key_unsigned ||
             tok->i == key_void ||
             tok->i == key_wchar_t));
  }